

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::CutpoolPropagation::recomputeCapacityThreshold(CutpoolPropagation *this,HighsInt cut)

{
  initializer_list<double> __l;
  reference pvVar1;
  int in_ESI;
  double in_RDI;
  double dVar2;
  double threshold;
  HighsInt i;
  double *arvalue;
  HighsInt *arindex;
  HighsInt end;
  HighsInt start;
  undefined4 in_stack_ffffffffffffff58;
  HighsInt in_stack_ffffffffffffff5c;
  HighsDynamicRowMatrix *in_stack_ffffffffffffff60;
  HighsDomain *this_00;
  double in_stack_ffffffffffffff80;
  value_type lower_bound;
  value_type local_60;
  double local_58;
  double local_50;
  value_type *local_48;
  undefined8 local_40;
  double local_38;
  HighsInt local_2c;
  double *local_28;
  HighsInt *local_20;
  HighsInt local_14;
  HighsInt local_10;
  int local_c;
  
  local_c = in_ESI;
  HighsCutPool::getMatrix(*(HighsCutPool **)((long)in_RDI + 0x10));
  local_10 = HighsDynamicRowMatrix::getRowStart(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c)
  ;
  HighsCutPool::getMatrix(*(HighsCutPool **)((long)in_RDI + 0x10));
  local_14 = HighsDynamicRowMatrix::getRowEnd(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  HighsCutPool::getMatrix(*(HighsCutPool **)((long)in_RDI + 0x10));
  local_20 = HighsDynamicRowMatrix::getARindex((HighsDynamicRowMatrix *)0x5bd2c0);
  HighsCutPool::getMatrix(*(HighsCutPool **)((long)in_RDI + 0x10));
  local_28 = HighsDynamicRowMatrix::getARvalue((HighsDynamicRowMatrix *)0x5bd2e1);
  dVar2 = HighsDomain::feastol((HighsDomain *)0x5bd2fa);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x78),(long)local_c
                     );
  *pvVar1 = -dVar2;
  for (local_2c = local_10; local_2c < local_14; local_2c = local_2c + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)((long)in_RDI + 8) + 800),(long)local_20[local_2c]);
    lower_bound = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        (*(long *)((long)in_RDI + 8) + 0x308),(long)local_20[local_2c]);
    if ((lower_bound != *pvVar1) || (NAN(lower_bound) || NAN(*pvVar1))) {
      dVar2 = ABS(local_28[local_2c]);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          (*(long *)((long)in_RDI + 8) + 800),(long)local_20[local_2c]);
      this_00 = (HighsDomain *)*pvVar1;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(*(long *)((long)in_RDI + 8) + 0x308),
                 (long)local_20[local_2c]);
      HighsDomain::feastol((HighsDomain *)0x5bd456);
      variableType(this_00,in_stack_ffffffffffffff5c);
      local_38 = boundRange(in_RDI,lower_bound,in_stack_ffffffffffffff80,
                            (HighsVarType)((ulong)dVar2 >> 0x38));
      local_38 = dVar2 * local_38;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x78),
                          (long)local_c);
      local_60 = *pvVar1;
      local_58 = local_38;
      local_50 = HighsDomain::feastol((HighsDomain *)0x5bd4e4);
      local_48 = &local_60;
      local_40 = 3;
      __l._M_array._4_4_ = in_stack_ffffffffffffff5c;
      __l._M_array._0_4_ = in_stack_ffffffffffffff58;
      __l._M_len = (size_type)this_00;
      in_stack_ffffffffffffff80 = std::max<double>(__l);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x78),
                          (long)local_c);
      *pvVar1 = in_stack_ffffffffffffff80;
    }
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::recomputeCapacityThreshold(HighsInt cut) {
  HighsInt start = cutpool->getMatrix().getRowStart(cut);
  HighsInt end = cutpool->getMatrix().getRowEnd(cut);
  const HighsInt* arindex = cutpool->getMatrix().getARindex();
  const double* arvalue = cutpool->getMatrix().getARvalue();
  capacityThreshold_[cut] = -domain->feastol();
  for (HighsInt i = start; i < end; ++i) {
    if (domain->col_upper_[arindex[i]] == domain->col_lower_[arindex[i]])
      continue;

    double threshold =
        std::fabs(arvalue[i]) * boundRange(domain->col_upper_[arindex[i]],
                                           domain->col_lower_[arindex[i]],
                                           domain->feastol(),
                                           domain->variableType(arindex[i]));

    capacityThreshold_[cut] =
        std::max({capacityThreshold_[cut], threshold, domain->feastol()});
  }
}